

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

wchar_t pick_chest_traps(object *obj)

{
  uint32_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t level;
  
  wVar3 = obj->kind->level;
  uVar1 = Rand_div(10);
  if (uVar1 == 0) {
    wVar2 = L'\x01';
  }
  else {
    wVar2 = pick_one_chest_trap(wVar3);
    if (L'\n' < wVar3) {
      uVar1 = Rand_div(4);
      if (uVar1 == 0) {
        level = L'\x19';
        if (wVar3 < L'\x19') {
          level = wVar3;
        }
        wVar3 = pick_one_chest_trap(level);
        wVar2 = wVar2 | wVar3;
      }
    }
  }
  return wVar2;
}

Assistant:

int pick_chest_traps(struct object *obj)
{
	int level = obj->kind->level;
	int trap = 0;

	/* One in ten chance of no trap */
	if (one_in_(10)) {
		return 1;
	}

	/* Pick a trap, add it */
	trap |= pick_one_chest_trap(level);

	/* Chance of a second trap (may overlap the first one) */
	if ((level > 10) && one_in_(4)) {
		/* Second traps are never deep */
		trap |= pick_one_chest_trap(MIN(level, 25));
	}

	return trap;
}